

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void handle_configure_request(xcb_connection_t *connection,xcb_configure_request_event_t *event)

{
  ulong local_40;
  size_t value_index;
  uint32_t values [6];
  uint16_t mask;
  xcb_configure_request_event_t *event_local;
  xcb_connection_t *connection_local;
  
  values[5]._2_1_ = (event->value_mask & 1) != 0;
  if (values[5]._2_1_) {
    value_index._0_4_ = (uint)(ushort)event->x;
  }
  values[5]._3_1_ = 0;
  local_40 = (ulong)values[5]._2_1_;
  if ((event->value_mask & 2) != 0) {
    values[5]._2_2_ = values[5]._2_2_ | 2;
    values[local_40 - 2] = (uint)(ushort)event->y;
    local_40 = local_40 + 1;
  }
  if ((event->value_mask & 4) != 0) {
    values[5]._2_2_ = values[5]._2_2_ | 4;
    values[local_40 - 2] = (uint)event->width;
    local_40 = local_40 + 1;
  }
  if ((event->value_mask & 8) != 0) {
    values[5]._2_2_ = values[5]._2_2_ | 8;
    values[local_40 - 2] = (uint)event->height;
    local_40 = local_40 + 1;
  }
  if ((event->value_mask & 0x20) != 0) {
    values[5]._2_2_ = values[5]._2_2_ | 0x20;
    values[local_40 - 2] = event->sibling;
    local_40 = local_40 + 1;
  }
  if ((event->value_mask & 0x40) != 0) {
    values[5]._2_2_ = values[5]._2_2_ | 0x40;
    values[local_40 - 2] = (uint)event->stack_mode;
  }
  if (values[5]._2_2_ != 0) {
    xcb_configure_window(connection,event->window,values[5]._2_2_,&value_index);
  }
  return;
}

Assistant:

static void handle_configure_request(xcb_connection_t *connection,
                                     xcb_configure_request_event_t *event)
{
        uint16_t mask = 0;
        uint32_t values[6];
        size_t value_index = 0;

        // Configure the new window dimentions
        if (event->value_mask & XCB_CONFIG_WINDOW_X) {
                mask |= XCB_CONFIG_WINDOW_X;
                values[value_index] = (uint16_t)event->x;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_Y) {
                mask |= XCB_CONFIG_WINDOW_Y;
                values[value_index] = (uint16_t)event->y;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_WIDTH) {
                mask |= XCB_CONFIG_WINDOW_WIDTH;
                values[value_index] = event->width;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_HEIGHT) {
                mask |= XCB_CONFIG_WINDOW_HEIGHT;
                values[value_index] = event->height;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_SIBLING) {
                mask |= XCB_CONFIG_WINDOW_SIBLING;
                values[value_index] = event->sibling;

                value_index++;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_STACK_MODE) {
                mask |= XCB_CONFIG_WINDOW_STACK_MODE;
                values[value_index] = event->stack_mode;

                value_index++;
        }

        if (mask == 0) {
                // Nothing to do (we ignore XCB_CONFIG_WINDOW_BORDER_WIDTH)
                return;
        }

        xcb_configure_window(connection, event->window, mask, (uint32_t *)&values);
}